

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::RelativeIfUnder(string *__return_storage_ptr__,string *top,string *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __type _Var2;
  bool bVar3;
  string local_58 [55];
  undefined1 local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *in_local;
  string *top_local;
  string *out;
  
  local_21 = 0;
  local_20 = in;
  in_local = top;
  top_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  _Var2 = std::operator==(local_20,in_local);
  if (_Var2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,".");
  }
  else {
    bVar3 = cmsys::SystemTools::IsSubDirectory(local_20,in_local);
    pbVar1 = local_20;
    if (bVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_58,(ulong)pbVar1);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::RelativeIfUnder(std::string const& top,
                                           std::string const& in)
{
  std::string out;
  if (in == top) {
    out = ".";
  } else if (cmSystemTools::IsSubDirectory(in, top)) {
    out = in.substr(top.size() + 1);
  } else {
    out = in;
  }
  return out;
}